

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_linear_resampler_init_preallocated
                    (ma_linear_resampler_config *pConfig,void *pHeap,ma_linear_resampler *pResampler
                    )

{
  ma_uint32 mVar1;
  undefined4 uVar2;
  undefined1 local_70 [8];
  ma_linear_resampler_heap_layout heapLayout;
  ma_result result;
  ma_linear_resampler *pResampler_local;
  void *pHeap_local;
  ma_linear_resampler_config *pConfig_local;
  
  if (pResampler == (ma_linear_resampler *)0x0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    memset(pResampler,0,0x88);
    heapLayout.lpfOffset._4_4_ =
         ma_linear_resampler_get_heap_layout(pConfig,(ma_linear_resampler_heap_layout *)local_70);
    pConfig_local._4_4_ = heapLayout.lpfOffset._4_4_;
    if (heapLayout.lpfOffset._4_4_ == MA_SUCCESS) {
      mVar1 = pConfig->channels;
      (pResampler->config).format = pConfig->format;
      (pResampler->config).channels = mVar1;
      mVar1 = pConfig->sampleRateOut;
      (pResampler->config).sampleRateIn = pConfig->sampleRateIn;
      (pResampler->config).sampleRateOut = mVar1;
      uVar2 = *(undefined4 *)&pConfig->field_0x14;
      (pResampler->config).lpfOrder = pConfig->lpfOrder;
      *(undefined4 *)&(pResampler->config).field_0x14 = uVar2;
      (pResampler->config).lpfNyquistFactor = pConfig->lpfNyquistFactor;
      pResampler->_pHeap = pHeap;
      if (local_70 != (undefined1  [8])0x0) {
        memset(pHeap,0,(size_t)local_70);
      }
      if (pConfig->format == ma_format_f32) {
        (pResampler->x0).f32 = (float *)((long)pHeap + heapLayout.sizeInBytes);
        (pResampler->x1).f32 = (float *)((long)pHeap + heapLayout.x0Offset);
      }
      else {
        (pResampler->x0).f32 = (float *)((long)pHeap + heapLayout.sizeInBytes);
        (pResampler->x1).f32 = (float *)((long)pHeap + heapLayout.x0Offset);
      }
      pConfig_local._4_4_ =
           ma_linear_resampler_set_rate_internal
                     (pResampler,pHeap,(ma_linear_resampler_heap_layout *)local_70,
                      pConfig->sampleRateIn,pConfig->sampleRateOut,0);
      if (pConfig_local._4_4_ == MA_SUCCESS) {
        pResampler->inTimeInt = 1;
        pResampler->inTimeFrac = 0;
        pConfig_local._4_4_ = MA_SUCCESS;
      }
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_linear_resampler_init_preallocated(const ma_linear_resampler_config* pConfig, void* pHeap, ma_linear_resampler* pResampler)
{
    ma_result result;
    ma_linear_resampler_heap_layout heapLayout;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pResampler);

    result = ma_linear_resampler_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pResampler->config = *pConfig;

    pResampler->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    if (pConfig->format == ma_format_f32) {
        pResampler->x0.f32 = (float*)ma_offset_ptr(pHeap, heapLayout.x0Offset);
        pResampler->x1.f32 = (float*)ma_offset_ptr(pHeap, heapLayout.x1Offset);
    } else {
        pResampler->x0.s16 = (ma_int16*)ma_offset_ptr(pHeap, heapLayout.x0Offset);
        pResampler->x1.s16 = (ma_int16*)ma_offset_ptr(pHeap, heapLayout.x1Offset);
    }

    /* Setting the rate will set up the filter and time advances for us. */
    result = ma_linear_resampler_set_rate_internal(pResampler, pHeap, &heapLayout, pConfig->sampleRateIn, pConfig->sampleRateOut, /* isResamplerAlreadyInitialized = */ MA_FALSE);
    if (result != MA_SUCCESS) {
        return result;
    }

    pResampler->inTimeInt  = 1;  /* Set this to one to force an input sample to always be loaded for the first output frame. */
    pResampler->inTimeFrac = 0;

    return MA_SUCCESS;
}